

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.c
# Opt level: O2

int CpuFeatures_StringView_ParsePositiveNumber(StringView view)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  StringView SVar7;
  int iStack_20;
  
  pcVar4 = (char *)view.size;
  pcVar5 = view.ptr;
  if (pcVar4 != (char *)0x0) {
    SVar7 = str("0x");
    pcVar3 = (char *)SVar7.size;
    _Var1 = CpuFeatures_StringView_StartsWith(view,SVar7);
    if (_Var1) {
      pcVar5 = pcVar5 + (long)pcVar3;
      if (pcVar4 < pcVar3) {
        pcVar5 = (char *)0x0;
      }
      bVar6 = pcVar4 < pcVar3;
      pcVar4 = pcVar4 + -(long)pcVar3;
      if (bVar6) {
        pcVar4 = (char *)0x0;
      }
      iStack_20 = 0x10;
    }
    else {
      iStack_20 = 10;
    }
    SVar7.size = (size_t)pcVar4;
    SVar7.ptr = pcVar5;
    iVar2 = ParsePositiveNumberWithBase(SVar7,iStack_20);
    return iVar2;
  }
  return -1;
}

Assistant:

int CpuFeatures_StringView_ParsePositiveNumber(const StringView view) {
  if (view.size) {
    const StringView hex_prefix = str("0x");
    if (CpuFeatures_StringView_StartsWith(view, hex_prefix)) {
      const StringView span_no_prefix =
          CpuFeatures_StringView_PopFront(view, hex_prefix.size);
      return ParsePositiveNumberWithBase(span_no_prefix, 16);
    }
    return ParsePositiveNumberWithBase(view, 10);
  }
  return -1;
}